

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitops.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  iVar9 = 0;
  do {
    uVar3 = rand();
    iVar4 = rand();
    uVar8 = (ulong)uVar3 << 0x20 | (long)iVar4;
    if (uVar8 == 0) {
      __assert_fail("x != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/bitops.hpp"
                    ,0x33,"unsigned int trailing_zeros(uint64_t)");
    }
    iVar7 = 0;
    iVar10 = 0;
    if (((long)iVar4 & 1U) == 0) {
      iVar10 = 0;
      uVar5 = uVar8;
      do {
        iVar10 = iVar10 + 1;
        uVar2 = uVar5 & 2;
        uVar5 = uVar5 >> 1;
      } while (uVar2 == 0);
    }
    if (-1 < (long)uVar8) {
      iVar7 = 0;
      uVar5 = uVar8;
      do {
        iVar7 = iVar7 + 1;
        uVar5 = uVar5 * 2;
      } while (-1 < (long)uVar5);
    }
    lVar1 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    uVar8 = uVar8 >> 0x10 | uVar8;
    uVar8 = uVar8 >> 0x20 | uVar8;
    iVar4 = *(int *)(log2_64(unsigned_long)::tab64 +
                    ((uVar8 - (uVar8 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a) * 4);
    if (iVar10 != (int)lVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error! trailing zeros: ",0x17);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," != ",4);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if (0x3f - iVar4 != iVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error! leading zeros: ",0x16);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," != ",4);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 100000000);
  return 0;
}

Assistant:

int main()
{
    // run a large set of random tests
    unsigned int sum = 0;
    int num_tests = 100000000;
    for (int i = 0; i < num_tests; ++i)
    {
        uint64_t x = 0;
        x |= static_cast<uint64_t>(rand()) << 32;
        x |= static_cast<uint64_t>(rand());

        unsigned int t1 = trailing_zeros(x);
        unsigned int t2 = reference_trailing_zeros(x);
        //unsigned int t2 = t1;
        //sum += t2;

        unsigned int l1 = leading_zeros(x);
        unsigned int l2 = reference_leading_zeros(x);
        //unsigned int l2 = l1;
        //sum += l2;

        if (t1 != t2) {
            std::cerr << "Error! trailing zeros: " << t1 << " != " << t2 << std::endl;
        }
        if (l1 != l2) {
            std::cerr << "Error! leading zeros: " << l1 << " != " << l2 << std::endl;
        }
    }
    return sum;
}